

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O0

string * FormatParagraph_abi_cxx11_(string_view in,size_t width,size_t indent)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  size_type sVar1;
  const_reference pvVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_RCX;
  string *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  long in_FS_OFFSET;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  size_t finalspace;
  size_t rem_width;
  size_t linelen;
  size_t lineend;
  size_t indented;
  size_t ptr;
  stringstream out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  ostream *in_stack_fffffffffffffd30;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd38;
  allocator<char> *in_stack_fffffffffffffd40;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd48;
  ostream *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  size_type local_230;
  size_type local_1f8;
  basic_string_view<char,_std::char_traits<char>_> *local_1f0;
  ulong local_1e8;
  allocator<char> local_1c1 [17];
  string local_1b0 [32];
  stringstream local_190 [16];
  ostream local_180 [376];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RCX < in_R8) {
    __assert_fail("width >= indent",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/util/strencodings.cpp"
                  ,0x100,"std::string FormatParagraph(std::string_view, size_t, size_t)");
  }
  std::__cxx11::stringstream::stringstream(local_190);
  local_1e8 = 0;
  local_1f0 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  do {
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd28
                      );
    if (sVar1 <= local_1e8) {
LAB_00361765:
      std::__cxx11::stringstream::str();
      std::__cxx11::stringstream::~stringstream(local_190);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return in_RDI;
    }
    local_1f8 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                          (in_stack_fffffffffffffd38,
                           (char)((ulong)in_stack_fffffffffffffd30 >> 0x38),
                           (size_type)in_stack_fffffffffffffd28);
    if (local_1f8 == 0xffffffffffffffff) {
      local_1f8 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffffd28);
    }
    if ((ulong)((long)in_RCX - (long)local_1f0) < local_1f8 - local_1e8) {
      local_230 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50,
                             (size_type)in_stack_fffffffffffffd48);
      if (((local_230 == 0xffffffffffffffff) || (local_230 < local_1e8)) &&
         (local_230 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50,
                                 (size_type)in_stack_fffffffffffffd48),
         local_230 == 0xffffffffffffffff)) {
        std::basic_string_view<char,_std::char_traits<char>_>::substr
                  (in_stack_fffffffffffffd48,(size_type)in_stack_fffffffffffffd40,
                   (size_type)in_stack_fffffffffffffd58);
        bVar3._M_str = (char *)in_stack_fffffffffffffd58;
        bVar3._M_len = (size_t)in_stack_fffffffffffffd50;
        std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd48,
                        bVar3);
        goto LAB_00361765;
      }
      in_stack_fffffffffffffd50 = local_180;
      bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (in_stack_fffffffffffffd48,(size_type)in_stack_fffffffffffffd40,
                         (size_type)in_stack_fffffffffffffd58);
      in_stack_fffffffffffffd58 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar3._M_str;
      __str_00._M_str = (char *)in_stack_fffffffffffffd58;
      __str_00._M_len = (size_t)in_stack_fffffffffffffd50;
      in_stack_fffffffffffffd48 =
           (basic_string_view<char,_std::char_traits<char>_> *)
           std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd48
                           ,__str_00);
      std::operator<<((ostream *)in_stack_fffffffffffffd48,"\n");
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (in_stack_fffffffffffffd38,(size_type)in_stack_fffffffffffffd30);
      local_1f8 = local_230;
      if (*pvVar2 == '\n') {
        local_1f0 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
      }
      else if (in_R8 != (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
        in_stack_fffffffffffffd30 = local_180;
        in_stack_fffffffffffffd40 = local_1c1;
        in_stack_fffffffffffffd38 = in_R8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd58,(size_type)in_stack_fffffffffffffd50,
                   (char)((ulong)in_stack_fffffffffffffd48 >> 0x38),in_stack_fffffffffffffd40);
        std::operator<<(in_stack_fffffffffffffd30,local_1b0);
        std::__cxx11::string::~string(in_stack_fffffffffffffd28);
        std::allocator<char>::~allocator(local_1c1);
        local_1f0 = in_R8;
      }
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::substr
                (in_stack_fffffffffffffd48,(size_type)in_stack_fffffffffffffd40,
                 (size_type)in_stack_fffffffffffffd58);
      __str._M_str = (char *)in_stack_fffffffffffffd58;
      __str._M_len = (size_t)in_stack_fffffffffffffd50;
      std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd48,
                      __str);
      local_1f0 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
    }
    local_1e8 = local_1f8 + 1;
  } while( true );
}

Assistant:

std::string FormatParagraph(std::string_view in, size_t width, size_t indent)
{
    assert(width >= indent);
    std::stringstream out;
    size_t ptr = 0;
    size_t indented = 0;
    while (ptr < in.size())
    {
        size_t lineend = in.find_first_of('\n', ptr);
        if (lineend == std::string::npos) {
            lineend = in.size();
        }
        const size_t linelen = lineend - ptr;
        const size_t rem_width = width - indented;
        if (linelen <= rem_width) {
            out << in.substr(ptr, linelen + 1);
            ptr = lineend + 1;
            indented = 0;
        } else {
            size_t finalspace = in.find_last_of(" \n", ptr + rem_width);
            if (finalspace == std::string::npos || finalspace < ptr) {
                // No place to break; just include the entire word and move on
                finalspace = in.find_first_of("\n ", ptr);
                if (finalspace == std::string::npos) {
                    // End of the string, just add it and break
                    out << in.substr(ptr);
                    break;
                }
            }
            out << in.substr(ptr, finalspace - ptr) << "\n";
            if (in[finalspace] == '\n') {
                indented = 0;
            } else if (indent) {
                out << std::string(indent, ' ');
                indented = indent;
            }
            ptr = finalspace + 1;
        }
    }
    return out.str();
}